

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O0

void __thiscall
gmath::PinholeCamera::reconstructPoint(PinholeCamera *this,Vector3d *Pw,Vector2d *p,double d)

{
  double dVar1;
  undefined8 uVar2;
  SVector<double,_3> *in_RSI;
  Camera *in_RDI;
  double in_XMM0_Qa;
  Vector2d *unaff_retaddr;
  Vector3d *in_stack_00000008;
  PinholeCamera *in_stack_00000010;
  Vector3d Pc;
  SVector<double,_3> *in_stack_ffffffffffffff60;
  SVector<double,_3> *in_stack_ffffffffffffff68;
  SVector<double,_3> *in_stack_ffffffffffffff70;
  SMatrix<double,_3,_3> *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff88;
  IOException *in_stack_ffffffffffffff90;
  allocator local_41;
  string local_40 [32];
  double local_20;
  SVector<double,_3> *local_10;
  
  dVar1 = in_RDI[1].R.v[0][2];
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Cannot reconstruct point with unknown rho",&local_41);
    gutil::IOException::IOException(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    __cxa_throw(uVar2,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_20 = in_XMM0_Qa;
  local_10 = in_RSI;
  SVector<double,_3>::SVector((SVector<double,_3> *)&stack0xffffffffffffff90);
  reconstructLocal(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  SVector<double,_3>::operator*=
            ((SVector<double,_3> *)&stack0xffffffffffffff90,in_RDI[1].R.v[0][2] / local_20);
  Camera::getR(in_RDI);
  SMatrix<double,_3,_3>::operator*(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  Camera::getT(in_RDI);
  SVector<double,_3>::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  SVector<double,_3>::operator=(local_10,(SVector<double,_3> *)&stack0xffffffffffffff78);
  return;
}

Assistant:

void PinholeCamera::reconstructPoint(Vector3d &Pw, const Vector2d &p, double d)
const
{
  if (rho == 0)
  {
    throw gutil::IOException("Cannot reconstruct point with unknown rho");
  }

  assert(std::isfinite(d));

  Vector3d Pc;
  reconstructLocal(Pc, p);

  Pc*=rho/d;

  Pw=getR()*Pc+getT();
}